

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::PrintValue<pstore::chunked_sequence<int,2ul,4ul,4ul>,void>
               (chunked_sequence<int,_2UL,_4UL,_4UL> *container,ostream *os)

{
  int *piVar1;
  long lVar2;
  list_iterator lVar3;
  _List_node_base *p_Var4;
  const_iterator cVar5;
  iterator_base<true> iVar6;
  char local_45 [5];
  _List_node_base *local_40;
  list_iterator local_38;
  
  local_45[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 2,1);
  cVar5 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin(container);
  iVar6 = pstore::chunked_sequence<int,2ul,4ul,4ul>::
          end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>const,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<true>>
                    (container);
  if (SUB168((undefined1  [16])cVar5 ^ (undefined1  [16])iVar6,8) != 0 ||
      SUB168((undefined1  [16])cVar5 ^ (undefined1  [16])iVar6,0) != 0) {
    lVar2 = 0;
    do {
      local_40 = (_List_node_base *)iVar6.index_;
      local_38 = iVar6.chunk_it_._M_node;
      lVar3 = cVar5.chunk_it_._M_node;
      piVar1 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                         ((chunk *)(lVar3._M_node + 1),cVar5.index_);
      if (lVar2 != 0) {
        local_45[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_45,1);
        if (lVar2 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_00158d1a;
        }
      }
      local_45[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 1,1);
      std::ostream::operator<<((ostream *)os,*piVar1);
      iVar6.index_ = (size_t)local_40;
      iVar6.chunk_it_._M_node = local_38._M_node;
      p_Var4 = (_List_node_base *)(cVar5.index_ + 1);
      if (lVar3._M_node[1]._M_next <= p_Var4) {
        lVar3._M_node = (lVar3._M_node)->_M_next;
        p_Var4 = (_List_node_base *)0x0;
      }
      cVar5.index_ = (size_t)p_Var4;
      cVar5.chunk_it_._M_node = lVar3._M_node;
      lVar2 = lVar2 + 1;
    } while (p_Var4 != local_40 || lVar3._M_node != local_38._M_node);
    if (lVar2 != 0) {
LAB_00158d1a:
      local_45[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 3,1);
      iVar6.index_ = (size_t)local_40;
      iVar6.chunk_it_._M_node = local_38._M_node;
    }
  }
  local_40 = (_List_node_base *)iVar6.index_;
  local_38 = iVar6.chunk_it_._M_node;
  local_45[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }